

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

void __thiscall deci::ast_set_t::~ast_set_t(ast_set_t *this)

{
  ast_set_t *this_local;
  
  if (this->chain != (ast_item_t *)0x0) {
    (*this->chain->_vptr_ast_item_t[4])();
  }
  std::__cxx11::string::~string((string *)&this->identifier);
  ast_item_t::~ast_item_t(&this->super_ast_item_t);
  return;
}

Assistant:

ast_set_t::~ast_set_t() {
    delete this->chain;
  }